

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O1

void xc_mgga_initalize(xc_func_type *func,size_t np,xc_mgga_out_params *out)

{
  long lVar1;
  
  if (out->zk != (double *)0x0) {
    memset(out->zk,0,(long)(func->dim).zk * np * 8);
  }
  if (out->vrho != (double *)0x0) {
    memset(out->vrho,0,(long)(func->dim).vrho * np * 8);
    memset(out->vsigma,0,(long)(func->dim).vsigma * np * 8);
    if ((func->info->flags & 0x8000) != 0) {
      memset(out->vlapl,0,(long)(func->dim).vlapl * np * 8);
    }
    if ((func->info->flags & 0x10000) != 0) {
      memset(out->vtau,0,(long)(func->dim).vtau * np * 8);
    }
  }
  if (out->v2rho2 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v2rho2,0,(func->dim).v2rho2 * lVar1);
    memset(out->v2rhosigma,0,(func->dim).v2rhosigma * lVar1);
    memset(out->v2sigma2,0,(func->dim).v2sigma2 * lVar1);
    if ((func->info->flags & 0x8000) != 0) {
      memset(out->v2rholapl,0,(func->dim).v2rholapl * lVar1);
      memset(out->v2sigmalapl,0,(func->dim).v2sigmalapl * lVar1);
      memset(out->v2lapl2,0,(func->dim).v2lapl2 * lVar1);
    }
    if ((func->info->flags & 0x10000) != 0) {
      memset(out->v2rhotau,0,(func->dim).v2rhotau * lVar1);
      memset(out->v2sigmatau,0,(func->dim).v2sigmatau * lVar1);
      memset(out->v2tau2,0,(func->dim).v2tau2 * lVar1);
    }
    if ((~func->info->flags & 0x18000U) == 0) {
      memset(out->v2lapltau,0,(long)(func->dim).v2lapltau * np * 8);
    }
  }
  if (out->v3rho3 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v3rho3,0,(func->dim).v3rho3 * lVar1);
    memset(out->v3rho2sigma,0,(func->dim).v3rho2sigma * lVar1);
    memset(out->v3rhosigma2,0,(func->dim).v3rhosigma2 * lVar1);
    memset(out->v3sigma3,0,(func->dim).v3sigma3 * lVar1);
    if ((func->info->flags & 0x8000) != 0) {
      memset(out->v3rho2lapl,0,(func->dim).v3rho2lapl * lVar1);
      memset(out->v3rhosigmalapl,0,(func->dim).v3rhosigmalapl * lVar1);
      memset(out->v3rholapl2,0,(func->dim).v3rholapl2 * lVar1);
      memset(out->v3sigma2lapl,0,(func->dim).v3sigma2lapl * lVar1);
      memset(out->v3sigmalapl2,0,(func->dim).v3sigmalapl2 * lVar1);
      memset(out->v3lapl3,0,(func->dim).v3lapl3 * lVar1);
    }
    if ((func->info->flags & 0x10000) != 0) {
      memset(out->v3rho2tau,0,(func->dim).v3rho2tau * lVar1);
      memset(out->v3rhosigmatau,0,(func->dim).v3rhosigmatau * lVar1);
      memset(out->v3rhotau2,0,(func->dim).v3rhotau2 * lVar1);
      memset(out->v3sigma2tau,0,(func->dim).v3sigma2tau * lVar1);
      memset(out->v3sigmatau2,0,(func->dim).v3sigmatau2 * lVar1);
      memset(out->v3tau3,0,(func->dim).v3tau3 * lVar1);
    }
    if ((~func->info->flags & 0x18000U) == 0) {
      memset(out->v3rholapltau,0,(func->dim).v3rholapltau * lVar1);
      memset(out->v3sigmalapltau,0,(func->dim).v3sigmalapltau * lVar1);
      memset(out->v3lapl2tau,0,(func->dim).v3lapl2tau * lVar1);
      memset(out->v3lapltau2,0,(func->dim).v3lapltau2 * lVar1);
    }
  }
  if (out->v4rho4 != (double *)0x0) {
    lVar1 = np * 8;
    memset(out->v4rho4,0,(func->dim).v4rho4 * lVar1);
    memset(out->v4rho3sigma,0,(func->dim).v4rho3sigma * lVar1);
    memset(out->v4rho2sigma2,0,(func->dim).v4rho2sigma2 * lVar1);
    memset(out->v4rhosigma3,0,(func->dim).v4rhosigma3 * lVar1);
    memset(out->v4sigma4,0,(func->dim).v4sigma4 * lVar1);
    if ((func->info->flags & 0x8000) != 0) {
      memset(out->v4rho3lapl,0,(func->dim).v4rho3lapl * lVar1);
      memset(out->v4rho2sigmalapl,0,(func->dim).v4rho2sigmalapl * lVar1);
      memset(out->v4rho2lapl2,0,(func->dim).v4rho2lapl2 * lVar1);
      memset(out->v4rhosigma2lapl,0,(func->dim).v4rhosigma2lapl * lVar1);
      memset(out->v4rhosigmalapl2,0,(func->dim).v4rhosigmalapl2 * lVar1);
      memset(out->v4rholapl3,0,(func->dim).v4rholapl3 * lVar1);
      memset(out->v4sigma3lapl,0,(func->dim).v4sigma3lapl * lVar1);
      memset(out->v4sigma2lapl2,0,(func->dim).v4sigma2lapl2 * lVar1);
      memset(out->v4sigmalapl3,0,(func->dim).v4sigmalapl3 * lVar1);
      memset(out->v4lapl4,0,(func->dim).v4lapl4 * lVar1);
    }
    if ((func->info->flags & 0x10000) != 0) {
      memset(out->v4rho3tau,0,(func->dim).v4rho3tau * lVar1);
      memset(out->v4rho2sigmatau,0,(func->dim).v4rho2sigmatau * lVar1);
      memset(out->v4rho2tau2,0,(func->dim).v4rho2tau2 * lVar1);
      memset(out->v4rhosigma2tau,0,(func->dim).v4rhosigma2tau * lVar1);
      memset(out->v4rhosigmatau2,0,(func->dim).v4rhosigmatau2 * lVar1);
      memset(out->v4rhotau3,0,(func->dim).v4rhotau3 * lVar1);
      memset(out->v4sigma3tau,0,(func->dim).v4sigma3tau * lVar1);
      memset(out->v4sigma2tau2,0,(func->dim).v4sigma2tau2 * lVar1);
      memset(out->v4sigmatau3,0,(func->dim).v4sigmatau3 * lVar1);
      memset(out->v4tau4,0,(func->dim).v4tau4 * lVar1);
    }
    if ((~func->info->flags & 0x18000U) == 0) {
      memset(out->v4rho2lapltau,0,(func->dim).v4rho2lapltau * lVar1);
      memset(out->v4rhosigmalapltau,0,(func->dim).v4rhosigmalapltau * lVar1);
      memset(out->v4rholapl2tau,0,(func->dim).v4rholapl2tau * lVar1);
      memset(out->v4rholapltau2,0,(func->dim).v4rholapltau2 * lVar1);
      memset(out->v4sigma2lapltau,0,(func->dim).v4sigma2lapltau * lVar1);
      memset(out->v4sigmalapl2tau,0,(func->dim).v4sigmalapl2tau * lVar1);
      memset(out->v4sigmalapltau2,0,(func->dim).v4sigmalapltau2 * lVar1);
      memset(out->v4lapl3tau,0,(func->dim).v4lapl3tau * lVar1);
      memset(out->v4lapl2tau2,0,(func->dim).v4lapl2tau2 * lVar1);
      memset(out->v4lapltau3,0,(func->dim).v4lapltau3 * lVar1);
      return;
    }
  }
  return;
}

Assistant:

void
xc_mgga_initalize(const xc_func_type *func, size_t np, xc_mgga_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

  /* initialize output to zero */
  if(out->zk != NULL)
    libxc_memset(out->zk, 0, dim->zk*np*sizeof(double));

  if(out->vrho != NULL){
    libxc_memset(out->vrho,   0, dim->vrho  *np*sizeof(double));
    libxc_memset(out->vsigma, 0, dim->vsigma*np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
      libxc_memset(out->vlapl,  0, dim->vlapl *np*sizeof(double));
    }
    if(func->info->flags & XC_FLAGS_NEEDS_TAU) {
      libxc_memset(out->vtau,   0, dim->vtau  *np*sizeof(double));
    }
  }

  if(out->v2rho2 != NULL){
    libxc_memset(out->v2rho2,     0, dim->v2rho2     *np*sizeof(double));
    libxc_memset(out->v2rhosigma, 0, dim->v2rhosigma *np*sizeof(double));
    libxc_memset(out->v2sigma2,   0, dim->v2sigma2   *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v2rholapl,   0, dim->v2rholapl  *np*sizeof(double));
      libxc_memset(out->v2sigmalapl, 0, dim->v2sigmalapl*np*sizeof(double));
      libxc_memset(out->v2lapl2,     0, dim->v2lapl2    *np*sizeof(double));
    }
    
    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v2rhotau,   0, dim->v2rhotau   *np*sizeof(double));
      libxc_memset(out->v2sigmatau, 0, dim->v2sigmatau *np*sizeof(double));
      libxc_memset(out->v2tau2,     0, dim->v2tau2     *np*sizeof(double));
    }
    
    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v2lapltau,   0, dim->v2lapltau  *np*sizeof(double));
    }
  }

  if(out->v3rho3 != NULL){
    libxc_memset(out->v3rho3,        0, dim->v3rho3       *np*sizeof(double));
    libxc_memset(out->v3rho2sigma,   0, dim->v3rho2sigma  *np*sizeof(double));
    libxc_memset(out->v3rhosigma2,   0, dim->v3rhosigma2  *np*sizeof(double));
    libxc_memset(out->v3sigma3,      0, dim->v3sigma3     *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v3rho2lapl,     0, dim->v3rho2lapl    *np*sizeof(double));
      libxc_memset(out->v3rhosigmalapl, 0, dim->v3rhosigmalapl*np*sizeof(double));
      libxc_memset(out->v3rholapl2,     0, dim->v3rholapl2    *np*sizeof(double));
      libxc_memset(out->v3sigma2lapl,   0, dim->v3sigma2lapl  *np*sizeof(double));
      libxc_memset(out->v3sigmalapl2,   0, dim->v3sigmalapl2  *np*sizeof(double));
      libxc_memset(out->v3lapl3,        0, dim->v3lapl3       *np*sizeof(double));
    }

    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v3rho2tau,     0, dim->v3rho2tau    *np*sizeof(double));
      libxc_memset(out->v3rhosigmatau, 0, dim->v3rhosigmatau*np*sizeof(double));
      libxc_memset(out->v3rhotau2,     0, dim->v3rhotau2    *np*sizeof(double));
      libxc_memset(out->v3sigma2tau,   0, dim->v3sigma2tau  *np*sizeof(double));
      libxc_memset(out->v3sigmatau2,   0, dim->v3sigmatau2  *np*sizeof(double));
      libxc_memset(out->v3tau3,        0, dim->v3tau3       *np*sizeof(double));
    }

    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v3rholapltau,   0, dim->v3rholapltau  *np*sizeof(double));
      libxc_memset(out->v3sigmalapltau, 0, dim->v3sigmalapltau*np*sizeof(double));
      libxc_memset(out->v3lapl2tau,     0, dim->v3lapl2tau    *np*sizeof(double));
      libxc_memset(out->v3lapltau2,     0, dim->v3lapltau2    *np*sizeof(double));
    }
  }

  if(out->v4rho4 != NULL){
    libxc_memset(out->v4rho4,         0, dim->v4rho4        *np*sizeof(double));
    libxc_memset(out->v4rho3sigma,    0, dim->v4rho3sigma   *np*sizeof(double));
    libxc_memset(out->v4rho2sigma2,   0, dim->v4rho2sigma2  *np*sizeof(double));
    libxc_memset(out->v4rhosigma3,    0, dim->v4rhosigma3   *np*sizeof(double));
    libxc_memset(out->v4sigma4,       0, dim->v4sigma4      *np*sizeof(double));

    if(func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN){
      libxc_memset(out->v4rho3lapl,        0, dim->v4rho3lapl       *np*sizeof(double));
      libxc_memset(out->v4rho2sigmalapl,   0, dim->v4rho2sigmalapl  *np*sizeof(double));
      libxc_memset(out->v4rho2lapl2,       0, dim->v4rho2lapl2      *np*sizeof(double));
      libxc_memset(out->v4rhosigma2lapl,   0, dim->v4rhosigma2lapl  *np*sizeof(double));
      libxc_memset(out->v4rhosigmalapl2,   0, dim->v4rhosigmalapl2  *np*sizeof(double));
      libxc_memset(out->v4rholapl3,        0, dim->v4rholapl3       *np*sizeof(double));
      libxc_memset(out->v4sigma3lapl,      0, dim->v4sigma3lapl     *np*sizeof(double));
      libxc_memset(out->v4sigma2lapl2,     0, dim->v4sigma2lapl2    *np*sizeof(double));
      libxc_memset(out->v4sigmalapl3,      0, dim->v4sigmalapl3     *np*sizeof(double));
      libxc_memset(out->v4lapl4,           0, dim->v4lapl4          *np*sizeof(double));
    }

    if(func->info->flags & XC_FLAGS_NEEDS_TAU){
      libxc_memset(out->v4rho3tau,      0, dim->v4rho3tau     *np*sizeof(double));
      libxc_memset(out->v4rho2sigmatau, 0, dim->v4rho2sigmatau*np*sizeof(double));
      libxc_memset(out->v4rho2tau2,     0, dim->v4rho2tau2    *np*sizeof(double));
      libxc_memset(out->v4rhosigma2tau, 0, dim->v4rhosigma2tau*np*sizeof(double));
      libxc_memset(out->v4rhosigmatau2, 0, dim->v4rhosigmatau2*np*sizeof(double));
      libxc_memset(out->v4rhotau3,      0, dim->v4rhotau3     *np*sizeof(double));
      libxc_memset(out->v4sigma3tau,    0, dim->v4sigma3tau   *np*sizeof(double));
      libxc_memset(out->v4sigma2tau2,   0, dim->v4sigma2tau2  *np*sizeof(double));
      libxc_memset(out->v4sigmatau3,    0, dim->v4sigmatau3   *np*sizeof(double));
      libxc_memset(out->v4tau4,         0, dim->v4tau4        *np*sizeof(double));
    }

    if((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (func->info->flags & XC_FLAGS_NEEDS_TAU)) {
      libxc_memset(out->v4rho2lapltau,     0, dim->v4rho2lapltau    *np*sizeof(double));
      libxc_memset(out->v4rhosigmalapltau, 0, dim->v4rhosigmalapltau*np*sizeof(double));
      libxc_memset(out->v4rholapl2tau,     0, dim->v4rholapl2tau    *np*sizeof(double));
      libxc_memset(out->v4rholapltau2,     0, dim->v4rholapltau2    *np*sizeof(double));
      libxc_memset(out->v4sigma2lapltau,   0, dim->v4sigma2lapltau  *np*sizeof(double));
      libxc_memset(out->v4sigmalapl2tau,   0, dim->v4sigmalapl2tau  *np*sizeof(double));
      libxc_memset(out->v4sigmalapltau2,   0, dim->v4sigmalapltau2  *np*sizeof(double));
      libxc_memset(out->v4lapl3tau,        0, dim->v4lapl3tau       *np*sizeof(double));
      libxc_memset(out->v4lapl2tau2,       0, dim->v4lapl2tau2      *np*sizeof(double));
      libxc_memset(out->v4lapltau3,        0, dim->v4lapltau3       *np*sizeof(double));
    }
  }

}